

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::Arena::Init(Arena *this)

{
  long *plVar1;
  long lVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  long *plVar7;
  long *in_FS_OFFSET;
  LogFinisher local_59;
  LogMessage local_58;
  
  lVar5 = lifecycle_id_generator_;
  LOCK();
  UNLOCK();
  lVar2 = lifecycle_id_generator_ + 1;
  *(long *)this = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar2;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (Arena)0x1;
  plVar7 = *(long **)(this + 0x50);
  if ((plVar7 != (long *)0x0) && (uVar4 = *(ulong *)(this + 0x58), uVar4 != 0)) {
    if (uVar4 < 0x20) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x46);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,": Initial block size too small for header.")
      ;
      internal::LogFinisher::operator=(&local_59,pLVar3);
      internal::LogMessage::~LogMessage(&local_58);
      lVar5 = *(long *)this;
      plVar7 = *(long **)(this + 0x50);
      uVar4 = *(ulong *)(this + 0x58);
    }
    plVar7[3] = uVar4;
    plVar7[2] = 0x20;
    lVar2 = *in_FS_OFFSET;
    plVar1 = (long *)(lVar2 + -0x10);
    *plVar7 = (long)plVar1;
    *(long **)(lVar2 + -8) = plVar7;
    *plVar1 = lVar5;
    plVar7[1] = *(long *)(this + 8);
    *(long **)(this + 8) = plVar7;
    lVar5 = plVar7[3];
    if (lVar5 != plVar7[2]) {
      *(long **)(this + 0x10) = plVar7;
      lVar5 = plVar7[3];
    }
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + lVar5;
    this[0x28] = (Arena)0x0;
  }
  if (*(code **)(this + 0x70) == (code *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (**(code **)(this + 0x70))(this);
  }
  *(undefined8 *)(this + 0x38) = uVar6;
  return;
}

Assistant:

void Arena::Init() {
  lifecycle_id_ = lifecycle_id_generator_.GetNext();
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  owns_first_block_ = true;
  cleanup_list_ = 0;

  if (options_.initial_block != NULL && options_.initial_block_size > 0) {
    GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
        << ": Initial block size too small for header.";

    // Add first unowned block to list.
    Block* first_block = reinterpret_cast<Block*>(options_.initial_block);
    first_block->size = options_.initial_block_size;
    first_block->pos = kHeaderSize;
    first_block->next = NULL;
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
    owns_first_block_ = false;
  }

  // Call the initialization hook
  if (options_.on_arena_init != NULL) {
    hooks_cookie_ = options_.on_arena_init(this);
  } else {
    hooks_cookie_ = NULL;
  }
}